

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_io_nextAllConverters(UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  ushort uVar1;
  ushort *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  size_t sVar5;
  char *myStr;
  uint16_t *myContext;
  UErrorCode *param_2_local;
  int32_t *resultLength_local;
  UEnumeration *enumerator_local;
  
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.converterList;
  puVar2 = (ushort *)enumerator->context;
  if (*puVar2 < gMainTable.converterListSize) {
    uVar1 = *puVar2;
    *puVar2 = uVar1 + 1;
    enumerator_local = (UEnumeration *)(puVar4 + (int)(uint)puVar3[uVar1]);
    if (resultLength != (int32_t *)0x0) {
      sVar5 = strlen((char *)enumerator_local);
      *resultLength = (int32_t)sVar5;
    }
  }
  else {
    if (resultLength != (int32_t *)0x0) {
      *resultLength = 0;
    }
    enumerator_local = (UEnumeration *)0x0;
  }
  return (char *)enumerator_local;
}

Assistant:

static const char * U_CALLCONV
ucnv_io_nextAllConverters(UEnumeration *enumerator,
                            int32_t* resultLength,
                            UErrorCode * /*pErrorCode*/)
{
    uint16_t *myContext = (uint16_t *)(enumerator->context);

    if (*myContext < gMainTable.converterListSize) {
        const char *myStr = GET_STRING(gMainTable.converterList[(*myContext)++]);
        if (resultLength) {
            *resultLength = (int32_t)uprv_strlen(myStr);
        }
        return myStr;
    }
    /* Either we accessed a zero length list, or we enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}